

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O3

void __thiscall aiMetadata::aiMetadata(aiMetadata *this,aiMetadata *rhs)

{
  aiString **ppaVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  aiString *paVar6;
  aiMetadataEntry *paVar7;
  void *pvVar8;
  uint *puVar9;
  undefined8 *puVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  char *pcVar14;
  aiString *paVar15;
  ulong uVar16;
  undefined4 local_46c;
  undefined8 local_448;
  undefined1 local_430 [1024];
  
  uVar13 = rhs->mNumProperties;
  uVar12 = (ulong)uVar13;
  this->mNumProperties = uVar13;
  ppaVar1 = &this->mKeys;
  this->mKeys = (aiString *)0x0;
  this->mValues = (aiMetadataEntry *)0x0;
  paVar6 = (aiString *)operator_new__(uVar12 * 0x404);
  if (uVar12 == 0) {
    *ppaVar1 = paVar6;
  }
  else {
    paVar15 = paVar6;
    do {
      paVar15->length = 0;
      paVar15->data[0] = '\0';
      memset(paVar15->data + 1,0x1b,0x3ff);
      paVar15 = paVar15 + 1;
    } while (paVar15 != paVar6 + uVar12);
    *ppaVar1 = paVar6;
    if (uVar13 != 0) {
      lVar11 = 4;
      uVar16 = 0;
      do {
        paVar6 = rhs->mKeys;
        paVar15 = *ppaVar1;
        if (paVar15 != paVar6) {
          uVar13 = *(uint *)(paVar6->data + lVar11 + -8);
          *(uint *)(paVar15->data + lVar11 + -8) = uVar13;
          memcpy(paVar15->data + lVar11 + -4,paVar6->data + lVar11 + -4,(ulong)uVar13);
          (paVar15->data + lVar11 + -4)[uVar13] = '\0';
          uVar12 = (ulong)this->mNumProperties;
        }
        uVar16 = uVar16 + 1;
        lVar11 = lVar11 + 0x404;
      } while (uVar16 < uVar12);
      paVar7 = (aiMetadataEntry *)operator_new__(uVar12 << 4);
      this->mValues = paVar7;
      if ((int)uVar12 == 0) {
        return;
      }
      uVar12 = 0;
      do {
        this->mValues[uVar12].mType = rhs->mValues[uVar12].mType;
        paVar7 = rhs->mValues;
        switch(paVar7[uVar12].mType) {
        case AI_BOOL:
          pvVar8 = operator_new(1);
          this->mValues[uVar12].mData = pvVar8;
          *(undefined1 *)this->mValues[uVar12].mData = *rhs->mValues[uVar12].mData;
          break;
        case AI_INT32:
          uVar2 = *paVar7[uVar12].mData;
          puVar10 = (undefined8 *)operator_new(4);
          *(undefined4 *)puVar10 = uVar2;
          goto LAB_003c318a;
        case AI_UINT64:
          uVar3 = *paVar7[uVar12].mData;
          puVar10 = (undefined8 *)operator_new(8);
          *puVar10 = uVar3;
          goto LAB_003c318a;
        case AI_FLOAT:
          uVar2 = *paVar7[uVar12].mData;
          puVar10 = (undefined8 *)operator_new(4);
          *(undefined4 *)puVar10 = uVar2;
          goto LAB_003c318a;
        case AI_DOUBLE:
          uVar3 = *paVar7[uVar12].mData;
          puVar10 = (undefined8 *)operator_new(8);
          *puVar10 = uVar3;
LAB_003c318a:
          this->mValues[uVar12].mData = puVar10;
          break;
        case AI_AISTRING:
          local_430[0] = 0;
          memset(local_430 + 1,0x1b,0x3ff);
          uVar13 = rhs->mNumProperties;
          if ((ulong)uVar13 != 0) {
            paVar6 = *ppaVar1;
            uVar4 = paVar6[uVar12].length;
            pcVar14 = rhs->mKeys->data;
            lVar11 = 0;
            do {
              if ((((aiString *)(pcVar14 + -4))->length == uVar4) &&
                 (iVar5 = bcmp(pcVar14,paVar6[uVar12].data,(ulong)uVar4), iVar5 == 0)) {
                uVar13 = 0;
                if (*(int *)((long)&paVar7->mType + lVar11) == 5) {
                  puVar9 = *(uint **)((long)&paVar7->mData + lVar11);
                  uVar13 = *puVar9;
                  memcpy(local_430,puVar9 + 1,(ulong)uVar13);
                  local_430[uVar13] = 0;
                }
                goto LAB_003c3228;
              }
              lVar11 = lVar11 + 0x10;
              pcVar14 = pcVar14 + 0x404;
            } while ((ulong)uVar13 << 4 != lVar11);
          }
          uVar13 = 0;
LAB_003c3228:
          puVar9 = (uint *)operator_new(0x404);
          if (0x3fe < uVar13) {
            uVar13 = 0x3ff;
          }
          *puVar9 = uVar13;
          memcpy(puVar9 + 1,local_430,(ulong)uVar13);
          *(undefined1 *)((long)puVar9 + (ulong)uVar13 + 4) = 0;
          this->mValues[uVar12].mData = puVar9;
          break;
        case AI_AIVECTOR3D:
          uVar13 = rhs->mNumProperties;
          local_448 = 0;
          local_46c = 0;
          if ((ulong)uVar13 != 0) {
            paVar6 = *ppaVar1;
            uVar4 = paVar6[uVar12].length;
            pcVar14 = rhs->mKeys->data;
            lVar11 = 0;
            do {
              if ((((aiString *)(pcVar14 + -4))->length == uVar4) &&
                 (iVar5 = bcmp(pcVar14,paVar6[uVar12].data,(ulong)uVar4), iVar5 == 0)) {
                if (*(int *)((long)&paVar7->mType + lVar11) == 6) {
                  puVar10 = *(undefined8 **)((long)&paVar7->mData + lVar11);
                  local_448 = *puVar10;
                  local_46c = *(undefined4 *)(puVar10 + 1);
                }
                break;
              }
              lVar11 = lVar11 + 0x10;
              pcVar14 = pcVar14 + 0x404;
            } while ((ulong)uVar13 << 4 != lVar11);
          }
          puVar10 = (undefined8 *)operator_new(0xc);
          *puVar10 = local_448;
          *(undefined4 *)(puVar10 + 1) = local_46c;
          this->mValues[uVar12].mData = puVar10;
        }
        uVar12 = uVar12 + 1;
        if (this->mNumProperties <= uVar12) {
          return;
        }
      } while( true );
    }
  }
  paVar7 = (aiMetadataEntry *)operator_new__(uVar12 << 4);
  this->mValues = paVar7;
  return;
}

Assistant:

aiMetadata( const aiMetadata &rhs )
    : mNumProperties( rhs.mNumProperties )
    , mKeys( nullptr )
    , mValues( nullptr ) {
        mKeys = new aiString[ mNumProperties ];
        for ( size_t i = 0; i < static_cast<size_t>( mNumProperties ); ++i ) {
            mKeys[ i ] = rhs.mKeys[ i ];
        }
        mValues = new aiMetadataEntry[ mNumProperties ];
        for ( size_t i = 0; i < static_cast<size_t>(mNumProperties); ++i ) {
            mValues[ i ].mType = rhs.mValues[ i ].mType;
            switch ( rhs.mValues[ i ].mType ) {
            case AI_BOOL:
                mValues[ i ].mData = new bool;
                ::memcpy( mValues[ i ].mData, rhs.mValues[ i ].mData, sizeof(bool) );
                break;
            case AI_INT32: {
                int32_t v;
                ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( int32_t ) );
                mValues[ i ].mData = new int32_t( v );
                }
                break;
            case AI_UINT64: {
                    uint64_t v;
                    ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( uint64_t ) );
                    mValues[ i ].mData = new  uint64_t( v );
                }
                break;
            case AI_FLOAT: {
                    float v;
                    ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( float ) );
                    mValues[ i ].mData = new float( v );
                }
                break;
            case AI_DOUBLE: {
                    double v;
                    ::memcpy( &v, rhs.mValues[ i ].mData, sizeof( double ) );
                    mValues[ i ].mData = new double( v );
                }
                break;
            case AI_AISTRING: {
                    aiString v;
                    rhs.Get<aiString>( mKeys[ i ], v );
                    mValues[ i ].mData = new aiString( v );
                }
                break;
            case AI_AIVECTOR3D: {
                    aiVector3D v;
                    rhs.Get<aiVector3D>( mKeys[ i ], v );
                    mValues[ i ].mData = new aiVector3D( v );
                }
                break;
#ifndef SWIG
            case FORCE_32BIT:
#endif
            default:
                break;
            }

        }
    }